

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O3

iterator * __thiscall
unodb::
db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::iterator::seek(iterator *this,art_key_type search_key,bool *match,bool fwd)

{
  byte key_byte;
  byte bVar1;
  byte bVar2;
  node_type nVar3;
  key_prefix_snapshot kVar4;
  undefined1 uVar5;
  uint uVar6;
  key_prefix_snapshot kVar7;
  iterator *piVar8;
  stack_entry *psVar9;
  ulong uVar10;
  size_t __n;
  ulong uVar11;
  undefined7 in_register_00000081;
  ulong uVar12;
  byte bVar13;
  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *pbVar14;
  uint *puVar15;
  void *__src;
  find_result fVar16;
  undefined1 local_b8 [8];
  iter_result_opt cnxt;
  undefined1 local_80 [8];
  iter_result_opt nxt;
  key_prefix_snapshot local_50;
  key_prefix_snapshot key_prefix;
  iterator *local_40;
  undefined4 local_34;
  
  uVar10 = search_key.field_0._8_8_;
  nxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>.
  _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
  _24_8_ = search_key.field_0._0_8_;
  local_34 = (undefined4)CONCAT71(in_register_00000081,fwd);
  if ((this->stack_).c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->stack_).c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      std::
      deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ::pop_back(&(this->stack_).c);
    } while ((this->stack_).c.
             super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             (this->stack_).c.
             super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  (this->keybuf_).off = 0;
  *match = false;
  kVar7 = (key_prefix_snapshot)((key_prefix_snapshot *)this->db_)->u64;
  if (kVar7.u64 == 0) {
    return this;
  }
  bVar13 = kVar7.f.key_prefix._M_elems[0];
  uVar12 = uVar10;
  __src = (void *)nxt.
                  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                  ._24_8_;
  kVar4 = key_prefix;
  do {
    key_prefix = kVar7;
    local_40 = this;
    if ((key_prefix.u64 & 7) == 0) {
      puVar15 = (uint *)(key_prefix.u64 & 0xfffffffffffffff8);
      nxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
      _M_payload._M_value.node.tagged_ptr._0_2_ = 0xffff;
      nxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
      _M_payload._8_8_ = 0;
      local_80 = (undefined1  [8])key_prefix;
      key_prefix = kVar4;
      std::
      deque<unodb::detail::iter_result<unodb::detail::node_header>,std::allocator<unodb::detail::iter_result<unodb::detail::node_header>>>
      ::emplace_back<unodb::detail::iter_result<unodb::detail::node_header>>
                ((deque<unodb::detail::iter_result<unodb::detail::node_header>,std::allocator<unodb::detail::iter_result<unodb::detail::node_header>>>
                  *)&this->stack_,(iter_result<unodb::detail::node_header> *)local_80);
      uVar11 = (ulong)*puVar15;
      uVar12 = uVar10;
      if (uVar11 < uVar10) {
        uVar12 = uVar11;
      }
      uVar6 = memcmp((void *)nxt.
                             super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                             ._24_8_,puVar15 + 2,uVar12);
      if (uVar6 == 0) {
        if (uVar11 == uVar10) {
          *match = true;
          return this;
        }
        uVar6 = -(uint)(uVar10 < uVar11) | 1;
      }
      if ((char)local_34 == '\0') {
        if (0 < (int)uVar6) {
          return this;
        }
LAB_001b271f:
        piVar8 = prior(this);
        return piVar8;
      }
      if ((int)uVar6 < 0) {
        return this;
      }
LAB_001b2703:
      piVar8 = next(this);
      return piVar8;
    }
    bVar13 = bVar13 & 7;
    pbVar14 = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
               *)(key_prefix.u64 & 0xfffffffffffffff8);
    kVar7._0_7_ = *(_Type *)(key_prefix_data *)&pbVar14->k_prefix;
    kVar7._7_1_ = *(key_prefix_size *)((long)&pbVar14->k_prefix + 7);
    uVar11 = kVar7.u64 >> 0x38;
    local_80 = (undefined1  [8])0x0;
    __n = 8;
    if (uVar12 < 8) {
      __n = uVar12;
    }
    local_50 = kVar7;
    memcpy(local_80,__src,__n);
    uVar6 = detail::key_prefix_snapshot::get_shared_length
                      ((key_prefix_snapshot *)&local_50.f,(uint64_t)local_80);
    if (uVar6 < kVar7._7_1_) {
      if (local_50.f.key_prefix_length <= uVar6) {
        __assert_fail("i < length()",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                      ,0x248,
                      "auto unodb::detail::key_prefix_snapshot::operator[](std::size_t) const");
      }
      bVar1 = *(byte *)((long)__src + (ulong)uVar6);
      bVar2 = *(byte *)((long)&local_50 + (ulong)uVar6);
      if (bVar1 == bVar2) {
        __assert_fail("cmp_ != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                      ,0x4ce,
                      "typename db<Key, Value>::iterator &unodb::db<std::span<const std::byte>, std::span<const std::byte>>::iterator::seek(art_key_type, bool &, bool) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                     );
      }
      if ((char)local_34 == '\0') {
        kVar7 = key_prefix;
        piVar8 = local_40;
        if (bVar2 <= bVar1) {
LAB_001b277b:
          piVar8 = right_most_traversal(piVar8,(node_ptr)kVar7.f);
          return piVar8;
        }
        this = left_most_traversal(local_40,(node_ptr)key_prefix.f);
        goto LAB_001b271f;
      }
      kVar7 = key_prefix;
      piVar8 = local_40;
      if (bVar1 < bVar2) {
LAB_001b26de:
        piVar8 = left_most_traversal(piVar8,(node_ptr)kVar7.f);
        return piVar8;
      }
      this = right_most_traversal(local_40,(node_ptr)key_prefix.f);
      goto LAB_001b2703;
    }
    cnxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>.
    _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
    ._24_8_ = uVar12;
    if (uVar12 < uVar11) {
LAB_001b28be:
      __assert_fail("num_bytes <= key.size_bytes()",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                    ,0xc0,
                    "void unodb::detail::basic_art_key<std::span<const std::byte>>::shift_right(const std::size_t) [KeyType = std::span<const std::byte>]"
                   );
    }
    key_byte = *(byte *)((long)__src + uVar11);
    fVar16 = detail::
             basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
             ::find_child(pbVar14,bVar13,key_byte);
    if ((key_prefix_snapshot *)fVar16.second == (key_prefix_snapshot *)0x0) {
      if ((char)local_34 == '\0') {
        detail::
        basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
        ::lte_key_byte((iter_result_opt *)local_80,pbVar14,bVar13,key_byte);
        piVar8 = local_40;
        if (nxt.
            super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
            ._M_payload.
            super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
            _M_payload._16_1_ == '\0') {
          if ((local_40->stack_).c.
              super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              (local_40->stack_).c.
              super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            return local_40;
          }
          pop(local_40);
          if ((piVar8->stack_).c.
              super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              (piVar8->stack_).c.
              super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            return piVar8;
          }
          while( true ) {
            psVar9 = top(piVar8);
            uVar10 = (psVar9->node).tagged_ptr;
            pbVar14 = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                       *)(uVar10 & 0xfffffffffffffff8);
            nVar3 = (node_type)uVar10;
            detail::
            basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
            ::prior((iter_result_opt *)local_b8,pbVar14,nVar3 & (I256|I48),psVar9->child_index);
            if (cnxt.
                super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                ._M_payload._16_1_ == '\x01') break;
            pop(piVar8);
            if ((piVar8->stack_).c.
                super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                (piVar8->stack_).c.
                super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              return piVar8;
            }
          }
          kVar7.f = (inode_fields)
                    detail::
                    basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                    ::get_child(pbVar14,nVar3 & (I256|I48),psVar9->child_index);
        }
        else {
          uVar5 = nxt.
                  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                  ._M_payload._M_value.node.tagged_ptr._1_1_;
          kVar7.f = (inode_fields)
                    detail::
                    basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                    ::get_child(pbVar14,bVar13,
                                nxt.
                                super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                                ._M_payload.
                                super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                                ._M_payload._M_value.node.tagged_ptr._1_1_);
          push(piVar8,(node_ptr)key_prefix.f,
               nxt.
               super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
               ._M_payload._M_value.node.tagged_ptr._0_1_,uVar5,
               (key_prefix_snapshot)
               nxt.
               super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
               ._M_payload._8_8_);
        }
        goto LAB_001b277b;
      }
      detail::
      basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
      ::gte_key_byte((iter_result_opt *)local_80,pbVar14,bVar13,key_byte);
      piVar8 = local_40;
      if (nxt.
          super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
          _M_payload._16_1_ == '\0') {
        if ((local_40->stack_).c.
            super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            (local_40->stack_).c.
            super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          return local_40;
        }
        pop(local_40);
        if ((piVar8->stack_).c.
            super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            (piVar8->stack_).c.
            super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          return piVar8;
        }
        while( true ) {
          psVar9 = top(piVar8);
          uVar10 = (psVar9->node).tagged_ptr;
          pbVar14 = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                     *)(uVar10 & 0xfffffffffffffff8);
          nVar3 = (node_type)uVar10;
          detail::
          basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
          ::next((iter_result_opt *)local_b8,pbVar14,nVar3 & (I256|I48),psVar9->child_index);
          if (cnxt.
              super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
              _M_payload._16_1_ == '\x01') break;
          pop(piVar8);
          if ((piVar8->stack_).c.
              super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              (piVar8->stack_).c.
              super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            return piVar8;
          }
        }
        kVar7.f = (inode_fields)
                  detail::
                  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                  ::get_child(pbVar14,nVar3 & (I256|I48),psVar9->child_index);
      }
      else {
        uVar5 = nxt.
                super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                ._M_payload._M_value.node.tagged_ptr._1_1_;
        kVar7.f = (inode_fields)
                  detail::
                  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                  ::get_child(pbVar14,bVar13,
                              nxt.
                              super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                              ._M_payload._M_value.node.tagged_ptr._1_1_);
        push(piVar8,(node_ptr)key_prefix.f,
             nxt.
             super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
             _M_payload._M_value.node.tagged_ptr._0_1_,uVar5,
             (key_prefix_snapshot)
             nxt.
             super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
             _M_payload._8_8_);
      }
      goto LAB_001b26de;
    }
    push(local_40,(node_ptr)key_prefix.f,key_byte,fVar16.first,local_50);
    if (cnxt.
        super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>._24_8_
        == uVar11) goto LAB_001b28be;
    kVar7 = (key_prefix_snapshot)((key_prefix_snapshot *)fVar16.second)->u64;
    uVar12 = cnxt.
             super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
             _24_8_ + ~uVar11;
    __src = (void *)((long)__src + uVar11 + 1);
    bVar13 = kVar7.f.key_prefix._M_elems[0];
    this = local_40;
    kVar4 = key_prefix;
  } while( true );
}

Assistant:

typename db<Key, Value>::iterator& db<Key, Value>::iterator::seek(
    art_key_type search_key, bool& match, bool fwd) {
  invalidate();   // invalidate the iterator (clear the stack).
  match = false;  // unless we wind up with an exact match.
  if (UNODB_DETAIL_UNLIKELY(db_.root == nullptr)) return *this;  // aka end()

  auto node{db_.root};
  const auto k = search_key;
  auto remaining_key{k};

  while (true) {
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      const auto* const leaf{node.template ptr<leaf_type*>()};
      push_leaf(node);
      const auto cmp_ = leaf->cmp(k);
      if (cmp_ == 0) {
        match = true;
        return *this;
      }
      if (fwd) {  // GTE semantics
        // if search_key < leaf, use the leaf, else next().
        return (cmp_ < 0) ? *this : next();
      }
      // LTE semantics: if search_key > leaf, use the leaf, else prior().
      return (cmp_ > 0) ? *this : prior();
    }
    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);
    auto* const inode{node.template ptr<inode_type*>()};  // some internal node.
    const auto key_prefix{inode->get_key_prefix().get_snapshot()};  // prefix
    const auto key_prefix_length{key_prefix.length()};  // length of that prefix
    const auto shared_length = key_prefix.get_shared_length(
        remaining_key.get_u64());  // #of prefix bytes matched.
    if (shared_length < key_prefix_length) {
      // We have visited an internal node whose prefix is longer than
      // the bytes in the key that we need to match.  To figure out
      // whether the search key would be located before or after the
      // current internal node, we need to compare the respective key
      // spans lexicographically.  Since we have [shared_length] bytes
      // in common, we know that the next byte will tell us the
      // relative ordering of the key vs the prefix. So now we compare
      // prefix and key and the first byte where they differ.
      const auto cmp_ = static_cast<int>(remaining_key[shared_length]) -
                        static_cast<int>(key_prefix[shared_length]);
      UNODB_DETAIL_ASSERT(cmp_ != 0);
      if (fwd) {
        if (cmp_ < 0) {
          // FWD and the search key is ordered before this node.  We
          // want the left-most leaf under the node.
          return left_most_traversal(node);
        }
        // FWD and the search key is ordered after this node.  Right
        // most descent and then next().
        return right_most_traversal(node).next();
      }
      // reverse traversal
      if (cmp_ < 0) {
        // REV and the search key is ordered before this node.  We
        // want the preceeding key.
        return left_most_traversal(node).prior();
      }
      // REV and the search key is ordered after this node.
      return right_most_traversal(node);
    }
    remaining_key.shift_right(key_prefix_length);
    const auto res = inode->find_child(node_type, remaining_key[0]);
    if (res.second == nullptr) {
      // We are on a key byte during the descent that is not mapped by
      // the current node.  Where we go next depends on whether we are
      // doing forward or reverse traversal.
      if (fwd) {
        // FWD: Take the next child_index that is mapped in the data
        // and then do a left-most descent to land on the key that is
        // the immediate successor of the desired key in the data.
        //
        // Note: We are probing with a key byte which does not appear
        // in our list of keys (this was verified above) so this will
        // always be the index the first entry whose key byte is
        // greater-than the probe value and [false] if there is no
        // such entry.
        //
        // Note: [node] has not been pushed onto the stack yet!
        auto nxt = inode->gte_key_byte(node_type, remaining_key[0]);
        if (!nxt) {
          // Pop entries off the stack until we find one with a
          // right-sibling of the path we took to this node and then
          // do a left-most descent under that right-sibling. If there
          // is no such parent, we will wind up with an empty stack
          // (aka the end() iterator) and return that state.
          if (!empty()) pop();
          while (!empty()) {
            const auto& centry = top();
            const auto cnode{centry.node};  // possible parent from the stack
            auto* const icnode{cnode.template ptr<inode_type*>()};
            const auto cnxt = icnode->next(
                cnode.type(), centry.child_index);  // right-sibling.
            if (cnxt) {
              auto nchild = icnode->get_child(cnode.type(), centry.child_index);
              return left_most_traversal(nchild);
            }
            pop();
          }
          return *this;  // stack is empty (aka end()).
        }
        const auto& tmp = nxt.value();  // unwrap.
        const auto child_index = tmp.child_index;
        const auto child = inode->get_child(node_type, child_index);
        push(node, tmp.key_byte, child_index, tmp.prefix);  // the path we took
        return left_most_traversal(child);  // left most traversal
      }
      // REV: Take the prior child_index that is mapped and then do
      // a right-most descent to land on the key that is the
      // immediate precessor of the desired key in the data.
      auto nxt = inode->lte_key_byte(node_type, remaining_key[0]);
      if (!nxt) {
        // Pop off the current entry until we find one with a
        // left-sibling and then do a right-most descent under that
        // left-sibling.  In the extreme case there is no such
        // previous entry and we will wind up with an empty stack.
        if (!empty()) pop();
        while (!empty()) {
          const auto& centry = top();
          const auto cnode{centry.node};  // possible parent from stack
          auto* const icnode{cnode.template ptr<inode_type*>()};
          const auto cnxt =
              icnode->prior(cnode.type(), centry.child_index);  // left-sibling.
          if (cnxt) {
            auto nchild = icnode->get_child(cnode.type(), centry.child_index);
            return right_most_traversal(nchild);
          }
          pop();
        }
        return *this;  // stack is empty (aka end()).
      }
      const auto& tmp = nxt.value();  // unwrap.
      const auto child_index{tmp.child_index};
      const auto child = inode->get_child(node_type, child_index);
      push(node, tmp.key_byte, child_index, tmp.prefix);  // the path we took
      return right_most_traversal(child);  // right most traversal
    }
    // Simple case. There is a child for the current key byte.
    const auto child_index{res.first};
    const auto* const child{res.second};
    push(node, remaining_key[0], child_index, key_prefix);
    node = *child;
    remaining_key.shift_right(1);
  }  // while ( true )
  UNODB_DETAIL_CANNOT_HAPPEN();
}